

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O3

bool test_uintwide_t_edge::test_ops_n_half_by_n_half(void)

{
  ushort *puVar1;
  ushort *puVar2;
  short *psVar3;
  short *psVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  uintwide_t<128U,_unsigned_short,_void,_false> *puVar9;
  uintwide_t<256U,_unsigned_short,_void,_false> *puVar10;
  enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<128U,_unsigned_short>_>
  *peVar11;
  enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short>_>
  *peVar12;
  long lVar13;
  uintwide_t<256U,_unsigned_short,_void,_false> *in_RCX;
  char cVar14;
  uint i;
  int iVar15;
  int i_3;
  uint i_1;
  uint_fast8_t i_2;
  byte bVar16;
  array<unsigned_short,_8UL> aVar17;
  uintwide_t<128U,_unsigned_short,_void,_false> uVar18;
  uintwide_t<128U,_unsigned_short,_void,_false> uVar19;
  uintwide_t<256U,_unsigned_short,_void,_false> pow_ctrl;
  uintwide_t<256U,_unsigned_short,_void,_false> prod_ctrl;
  uintwide_t<128U,_unsigned_short,_void,_false> right_half;
  uintwide_t<128U,_unsigned_short,_void,_false> x_half;
  uintwide_t<128U,_unsigned_short,_void,_false> right_half_1;
  uintwide_t<128U,_unsigned_short,_void,_false> pow_zero_half;
  array<unsigned_short,_8UL> local_d8;
  undefined1 local_c8 [16];
  array<unsigned_short,_8UL> local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  array<unsigned_short,_8UL> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  representation_type local_40;
  
  iVar15 = 0;
  bVar7 = true;
  do {
    aVar17.elems = (value_type_conflict3  [8])
                   generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                             (true,hex,0xf);
    local_98 = (undefined1  [16])
               generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                         (true,hex,0xf);
    local_d8.elems = aVar17.elems;
    puVar9 = math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_false>::operator*=
                       ((uintwide_t<128U,_unsigned_short,_void,_false> *)&local_d8,
                        (uintwide_t<128U,_unsigned_short,_void,_false> *)local_98);
    local_58 = *(undefined8 *)(puVar9->values).super_array<unsigned_short,_8UL>.elems;
    uStack_50 = *(undefined8 *)((puVar9->values).super_array<unsigned_short,_8UL>.elems + 4);
    local_c8 = ZEXT816(0);
    local_88 = local_98;
    local_78 = ZEXT816(0);
    local_d8.elems = aVar17.elems;
    puVar10 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator*=
                        ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_d8,
                         (uintwide_t<256U,_unsigned_short,_void,_false> *)local_88);
    local_b8.elems =
         *(value_type_conflict3 (*) [8])(puVar10->values).super_array<unsigned_short,_16UL>.elems;
    local_a8 = *(undefined1 (*) [16])((puVar10->values).super_array<unsigned_short,_16UL>.elems + 8)
    ;
    local_d8.elems[4] = (undefined2)uStack_50;
    local_d8.elems[5] = uStack_50._2_2_;
    local_d8.elems[6] = uStack_50._4_2_;
    local_d8.elems[7] = uStack_50._6_2_;
    local_d8.elems[0] = (undefined2)local_58;
    local_d8.elems[1] = local_58._2_2_;
    local_d8.elems[2] = local_58._4_2_;
    local_d8.elems[3] = local_58._6_2_;
    local_c8 = (undefined1  [16])0x0;
    lVar13 = 0x1e;
    do {
      if (lVar13 == -2) goto LAB_001135b3;
      uVar5 = *(ushort *)((long)local_d8.elems + lVar13);
      in_RCX = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)uVar5;
      puVar1 = (ushort *)((long)local_b8.elems + lVar13);
      lVar13 = lVar13 + -2;
    } while (uVar5 == *puVar1);
    bVar7 = false;
LAB_001135b3:
    iVar15 = iVar15 + 1;
  } while (iVar15 != 0x18);
  local_98._0_4_ = 2;
  do {
    local_88 = (undefined1  [16])
               generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                         (true,hex,4);
    aVar17.elems = (value_type_conflict3  [8])
                   math::wide_integer::pow<unsigned_int,128u,unsigned_short,void,false>
                             ((uintwide_t<128U,_unsigned_short,_void,_false> *)local_88,
                              (uint *)local_98);
    local_b8.elems[0] = local_88._0_2_;
    local_b8.elems[1] = local_88._2_2_;
    local_b8.elems[2] = local_88._4_2_;
    local_b8.elems[3] = local_88._6_2_;
    local_b8.elems[4] = local_88._8_2_;
    local_b8.elems[5] = local_88._10_2_;
    local_b8.elems[6] = local_88._12_2_;
    local_b8.elems[7] = local_88._14_2_;
    local_a8 = (undefined1  [16])0x0;
    math::wide_integer::pow<unsigned_int,256u,unsigned_short,void,false>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_d8,(wide_integer *)&local_b8,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)local_98,(uint *)in_RCX);
    local_a8 = (undefined1  [16])0x0;
    lVar13 = 0x1e;
    do {
      if (lVar13 == -2) goto LAB_00113664;
      uVar5 = *(ushort *)((long)local_b8.elems + lVar13);
      in_RCX = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)uVar5;
      puVar1 = (ushort *)((long)local_d8.elems + lVar13);
      lVar13 = lVar13 + -2;
    } while (uVar5 == *puVar1);
    bVar7 = false;
LAB_00113664:
    uVar8 = local_98._0_4_ + 1;
    local_98._0_4_ = uVar8;
    local_b8.elems = aVar17.elems;
  } while (uVar8 < 8);
  iVar15 = 0;
LAB_00113691:
  local_98 = (undefined1  [16])
             generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                       (true,dec,0x26);
  local_d8.elems =
       (value_type_conflict3  [8])
       generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                 (true,dec,0x26);
  local_b8.elems[0] = 0;
  local_b8.elems[1] = 0;
  local_b8.elems[2] = 0;
  local_b8.elems[3] = 0;
  local_b8.elems[4] = 0;
  local_b8.elems[5] = 0;
  local_b8.elems[6] = 0;
  local_b8.elems[7] = 0;
  puVar9 = math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_false>::operator*=
                     ((uintwide_t<128U,_unsigned_short,_void,_false> *)&local_d8,
                      (uintwide_t<128U,_unsigned_short,_void,_false> *)&local_b8);
  local_68.elems = *&(puVar9->values).super_array<unsigned_short,_8UL>.elems;
  local_40.super_array<unsigned_short,_8UL>.elems =
       (array<unsigned_short,_8UL>)
       math::wide_integer::
       pow<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>,128u,unsigned_short,void,false>
                 ((uintwide_t<128U,_unsigned_short,_void,_false> *)local_98,
                  (uintwide_t<128U,_unsigned_short,_void,_false> *)&local_68);
  auVar6 = local_98;
  local_b8.elems[0] = local_98._0_2_;
  local_b8.elems[1] = local_98._2_2_;
  local_b8.elems[2] = local_98._4_2_;
  local_b8.elems[3] = local_98._6_2_;
  local_b8.elems[4] = local_98._8_2_;
  local_b8.elems[5] = local_98._10_2_;
  local_b8.elems[6] = local_98._12_2_;
  local_b8.elems[7] = local_98._14_2_;
  local_a8 = (undefined1  [16])0x0;
  local_88._0_2_ = local_68.elems[0];
  local_88._2_2_ = local_68.elems[1];
  local_88._4_2_ = local_68.elems[2];
  local_88._6_2_ = local_68.elems[3];
  local_88._8_2_ = local_68.elems[4];
  local_88._10_2_ = local_68.elems[5];
  local_88._12_2_ = local_68.elems[6];
  local_88._14_2_ = local_68.elems[7];
  local_78 = (undefined1  [16])0x0;
  local_98 = auVar6;
  math::wide_integer::
  pow<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>,256u,unsigned_short,void,false>
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_d8,(wide_integer *)&local_b8,
             (uintwide_t<256U,_unsigned_short,_void,_false> *)local_88,in_RCX);
  local_b8 = local_40.super_array<unsigned_short,_8UL>.elems;
  local_a8 = (undefined1  [16])0x0;
  lVar13 = 0x1e;
  do {
    if (lVar13 == -2) {
      math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_false>::uintwide_t<int>
                ((uintwide_t<128U,_unsigned_short,_void,_false> *)local_88,1,
                 (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
      lVar13 = 0xe;
      goto LAB_00113785;
    }
    uVar5 = *(ushort *)((long)local_b8.elems + lVar13);
    in_RCX = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)uVar5;
    puVar1 = (ushort *)((long)local_d8.elems + lVar13);
    lVar13 = lVar13 + -2;
  } while (uVar5 == *puVar1);
  goto LAB_001137a1;
  while( true ) {
    uVar5 = *(ushort *)((long)local_40.super_array<unsigned_short,_8UL>.elems + lVar13);
    in_RCX = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)uVar5;
    puVar1 = (ushort *)(local_88 + lVar13);
    lVar13 = lVar13 + -2;
    if (uVar5 != *puVar1) break;
LAB_00113785:
    if (lVar13 == -2) goto LAB_001137a9;
  }
LAB_001137a1:
  bVar7 = false;
LAB_001137a9:
  iVar15 = iVar15 + 1;
  if (iVar15 == 8) goto code_r0x001137b6;
  goto LAB_00113691;
code_r0x001137b6:
  puVar10 = (uintwide_t<256U,_unsigned_short,_void,_false> *)0x3;
  do {
    local_88 = (undefined1  [16])
               generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                         (true,dec,0x26);
    aVar17.elems = (value_type_conflict3  [8])
                   math::wide_integer::rootk<128u,unsigned_short,void,false>
                             ((uintwide_t<128U,_unsigned_short,_void,_false> *)local_88,
                              (uint_fast8_t)puVar10);
    local_b8.elems[0] = local_88._0_2_;
    local_b8.elems[1] = local_88._2_2_;
    local_b8.elems[2] = local_88._4_2_;
    local_b8.elems[3] = local_88._6_2_;
    local_b8.elems[4] = local_88._8_2_;
    local_b8.elems[5] = local_88._10_2_;
    local_b8.elems[6] = local_88._12_2_;
    local_b8.elems[7] = local_88._14_2_;
    local_a8 = (undefined1  [16])0x0;
    math::wide_integer::rootk<256u,unsigned_short,void,false>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_d8,(wide_integer *)&local_b8,
               puVar10,(uint_fast8_t)in_RCX);
    local_a8 = (undefined1  [16])0x0;
    lVar13 = 0x1e;
    do {
      if (lVar13 == -2) goto LAB_0011384a;
      uVar5 = *(ushort *)((long)local_b8.elems + lVar13);
      in_RCX = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)uVar5;
      puVar1 = (ushort *)((long)local_d8.elems + lVar13);
      lVar13 = lVar13 + -2;
    } while (uVar5 == *puVar1);
    bVar7 = false;
LAB_0011384a:
    bVar16 = (uint_fast8_t)puVar10 + 1;
    puVar10 = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)bVar16;
    local_b8.elems = aVar17.elems;
  } while (bVar16 != 0xe);
  iVar15 = 2;
  do {
    aVar17.elems = (value_type_conflict3  [8])
                   generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                             (true,dec,0x26);
    local_d8.elems = aVar17.elems;
    peVar11 = math::wide_integer::uintwide_t<128u,unsigned_short,void,false>::operator>>=
                        ((uintwide_t<128u,unsigned_short,void,false> *)&local_d8,iVar15);
    local_58 = *(undefined8 *)(peVar11->values).super_array<unsigned_short,_8UL>.elems;
    uStack_50 = *(undefined8 *)((peVar11->values).super_array<unsigned_short,_8UL>.elems + 4);
    local_c8 = ZEXT816(0);
    local_d8.elems = aVar17.elems;
    peVar12 = math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::operator>>=
                        ((uintwide_t<256u,unsigned_short,void,false> *)&local_d8,iVar15);
    local_b8.elems =
         *(value_type_conflict3 (*) [8])(peVar12->values).super_array<unsigned_short,_16UL>.elems;
    local_a8 = *(undefined1 (*) [16])((peVar12->values).super_array<unsigned_short,_16UL>.elems + 8)
    ;
    local_d8.elems[4] = (undefined2)uStack_50;
    local_d8.elems[5] = uStack_50._2_2_;
    local_d8.elems[6] = uStack_50._4_2_;
    local_d8.elems[7] = uStack_50._6_2_;
    local_d8.elems[0] = (undefined2)local_58;
    local_d8.elems[1] = local_58._2_2_;
    local_d8.elems[2] = local_58._4_2_;
    local_d8.elems[3] = local_58._6_2_;
    local_c8 = (undefined1  [16])0x0;
    lVar13 = 0x1e;
    do {
      if (lVar13 == -2) goto LAB_0011390a;
      uVar5 = *(ushort *)((long)local_d8.elems + lVar13);
      in_RCX = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)uVar5;
      puVar1 = (ushort *)((long)local_b8.elems + lVar13);
      lVar13 = lVar13 + -2;
    } while (uVar5 == *puVar1);
    bVar7 = false;
LAB_0011390a:
    iVar15 = iVar15 + 1;
  } while (iVar15 != 0x28);
  iVar15 = 0x3ea;
LAB_0011391f:
  aVar17.elems = (value_type_conflict3  [8])
                 generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                           (true,dec,0x26);
  local_d8.elems = aVar17.elems;
  peVar11 = math::wide_integer::uintwide_t<128u,unsigned_short,void,false>::operator>>=
                      ((uintwide_t<128u,unsigned_short,void,false> *)&local_d8,iVar15);
  local_98 = *(undefined1 (*) [16])(peVar11->values).super_array<unsigned_short,_8UL>.elems;
  local_c8 = ZEXT816(0);
  local_d8.elems = aVar17.elems;
  peVar12 = math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::operator>>=
                      ((uintwide_t<256u,unsigned_short,void,false> *)&local_d8,iVar15);
  local_b8.elems =
       *(value_type_conflict3 (*) [8])(peVar12->values).super_array<unsigned_short,_16UL>.elems;
  local_a8 = *(undefined1 (*) [16])((peVar12->values).super_array<unsigned_short,_16UL>.elems + 8);
  local_d8.elems[0] = local_98._0_2_;
  local_d8.elems[1] = local_98._2_2_;
  local_d8.elems[2] = local_98._4_2_;
  local_d8.elems[3] = local_98._6_2_;
  local_d8.elems[4] = local_98._8_2_;
  local_d8.elems[5] = local_98._10_2_;
  local_d8.elems[6] = local_98._12_2_;
  local_d8.elems[7] = local_98._14_2_;
  local_c8 = (undefined1  [16])0x0;
  lVar13 = 0x1e;
  do {
    if (lVar13 == -2) {
      math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_false>::uintwide_t<int>
                ((uintwide_t<128U,_unsigned_short,_void,_false> *)local_88,0,
                 (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
      lVar13 = 0xe;
      goto LAB_001139cd;
    }
    uVar5 = *(ushort *)((long)local_d8.elems + lVar13);
    in_RCX = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)uVar5;
    puVar1 = (ushort *)((long)local_b8.elems + lVar13);
    lVar13 = lVar13 + -2;
  } while (uVar5 == *puVar1);
  goto LAB_001139e6;
  while( true ) {
    puVar1 = (ushort *)(local_98 + lVar13);
    in_RCX = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)*puVar1;
    puVar2 = (ushort *)(local_88 + lVar13);
    lVar13 = lVar13 + -2;
    if (*puVar1 != *puVar2) break;
LAB_001139cd:
    if (lVar13 == -2) goto LAB_001139ee;
  }
LAB_001139e6:
  bVar7 = false;
LAB_001139ee:
  iVar15 = iVar15 + 1;
  if (iVar15 == 0x3f4) {
    iVar15 = 0;
    do {
      uVar18 = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                         (true,dec,0x26);
      uVar19 = generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                         (true,dec,0x26);
      local_d8.elems =
           (value_type_conflict3  [8])
           ((undefined1  [16])uVar19.values.super_array<unsigned_short,_8UL>.elems ^
           (undefined1  [16])uVar18.values.super_array<unsigned_short,_8UL>.elems);
      local_c8 = (undefined1  [16])0x0;
      local_a8 = (undefined1  [16])0x0;
      lVar13 = 0x1e;
      do {
        if (lVar13 == -2) goto LAB_00113a86;
        uVar5 = *(ushort *)((long)local_b8.elems + lVar13);
        in_RCX = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)uVar5;
        puVar1 = (ushort *)((long)local_d8.elems + lVar13);
        lVar13 = lVar13 + -2;
      } while (uVar5 == *puVar1);
      bVar7 = false;
LAB_00113a86:
      iVar15 = iVar15 + 1;
      local_b8.elems = local_d8.elems;
    } while (iVar15 != 0x18);
    iVar15 = 0;
    local_b8.elems = local_d8.elems;
    do {
      local_a8 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])
                 generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                           (true,dec,0x26);
      local_68.elems =
           (value_type_conflict3  [8])
           generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                     (true,dec,0x26);
      aVar17.elems = (value_type_conflict3  [8])
                     math::wide_integer::gcd<128u,unsigned_short,void,false>
                               ((uintwide_t<128U,_unsigned_short,_void,_false> *)local_98,
                                (uintwide_t<128U,_unsigned_short,_void,_false> *)&local_68);
      local_b8.elems[0] = local_98._0_2_;
      local_b8.elems[1] = local_98._2_2_;
      local_b8.elems[2] = local_98._4_2_;
      local_b8.elems[3] = local_98._6_2_;
      local_b8.elems[4] = local_98._8_2_;
      local_b8.elems[5] = local_98._10_2_;
      local_b8.elems[6] = local_98._12_2_;
      local_b8.elems[7] = local_98._14_2_;
      local_a8 = (undefined1  [16])0x0;
      local_88._0_2_ = local_68.elems[0];
      local_88._2_2_ = local_68.elems[1];
      local_88._4_2_ = local_68.elems[2];
      local_88._6_2_ = local_68.elems[3];
      local_88._8_2_ = local_68.elems[4];
      local_88._10_2_ = local_68.elems[5];
      local_88._12_2_ = local_68.elems[6];
      local_88._14_2_ = local_68.elems[7];
      local_78 = (undefined1  [16])0x0;
      math::wide_integer::gcd<256u,unsigned_short,void,false>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_d8,
                 (wide_integer *)&local_b8,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_88
                 ,in_RCX);
      local_a8 = (undefined1  [16])0x0;
      lVar13 = 0x1e;
      do {
        if (lVar13 == -2) goto LAB_00113b64;
        uVar5 = *(ushort *)((long)local_b8.elems + lVar13);
        in_RCX = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)uVar5;
        puVar1 = (ushort *)((long)local_d8.elems + lVar13);
        lVar13 = lVar13 + -2;
      } while (uVar5 == *puVar1);
      bVar7 = false;
LAB_00113b64:
      iVar15 = iVar15 + 1;
      local_b8.elems = aVar17.elems;
    } while (iVar15 != 0x20);
    cVar14 = '\0';
    do {
      local_b8.elems =
           (value_type_conflict3  [8])
           generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,true>>
                     (false,dec,0x1f);
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
      uintwide_t<128U,_true,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_d8,
                 (uintwide_t<128U,_unsigned_short,_void,_true> *)&local_b8);
      local_88._0_2_ = local_d8.elems[0];
      local_88._2_2_ = local_d8.elems[1];
      local_88._4_2_ = local_d8.elems[2];
      local_88._6_2_ = local_d8.elems[3];
      local_88._8_2_ = local_d8.elems[4];
      local_88._10_2_ = local_d8.elems[5];
      local_88._12_2_ = local_d8.elems[6];
      local_88._14_2_ = local_d8.elems[7];
      auVar6 = local_88;
      local_88._14_2_ = local_d8.elems[7];
      if (-1 < (short)(local_b8.elems[7] ^ local_88._14_2_)) {
        lVar13 = 0xe;
        do {
          if (lVar13 == -2) goto LAB_00113bde;
          psVar3 = (short *)((long)local_b8.elems + lVar13);
          psVar4 = (short *)(local_88 + lVar13);
          lVar13 = lVar13 + -2;
        } while (*psVar3 == *psVar4);
      }
      bVar7 = false;
LAB_00113bde:
      cVar14 = cVar14 + '\x01';
      local_88 = auVar6;
      if (cVar14 == ' ') {
        return bVar7;
      }
    } while( true );
  }
  goto LAB_0011391f;
}

Assistant:

auto test_ops_n_half_by_n_half() -> bool
{
  auto result_is_ok = true;

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(24));
           ++i)
  {
    const auto left_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>
        (
            static_cast<int>(std::numeric_limits<local_uintwide_t_half_unsigned_type>::digits / 8)
          - static_cast<int>(INT8_C(1))
        )
      );

    const auto right_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>
        (
            static_cast<int>(std::numeric_limits<local_uintwide_t_half_unsigned_type>::digits / 8)
          - static_cast<int>(INT8_C(1))
        )
      );

    const auto prod_half = left_half * right_half;
    const auto prod_ctrl =   local_uintwide_t_small_unsigned_type(left_half)
                           * local_uintwide_t_small_unsigned_type(right_half);


    const auto result_multiply_is_ok = (local_uintwide_t_small_unsigned_type(prod_half) == prod_ctrl);

    result_is_ok = (result_multiply_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(2));
             i < static_cast<unsigned>(UINT8_C(8));
           ++i)
  {
    const auto x_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>(INT8_C(4))
      );

    const auto pow_half = pow(x_half, i);

    const auto pow_ctrl = pow(local_uintwide_t_small_unsigned_type(x_half), i);

    const auto result_pow_is_ok = (local_uintwide_t_small_unsigned_type(pow_half) == pow_ctrl);

    result_is_ok = (result_pow_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(8));
           ++i)
  {
    const auto arg_half  =   generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto zero_half =   generate_wide_integer_value<local_uintwide_t_half_unsigned_type>()
                           * local_uintwide_t_half_unsigned_type(zero_as_small_unsigned_type());

    const auto pow_zero_half = pow(arg_half, zero_half);

    const auto pow_zero_ctrl = pow(local_uintwide_t_small_unsigned_type(arg_half), local_uintwide_t_small_unsigned_type(zero_half));

    const auto result_pow_zero_is_ok = ((local_uintwide_t_small_unsigned_type(pow_zero_half) == pow_zero_ctrl) && (pow_zero_half == 1));

    result_is_ok = (result_pow_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<std::uint_fast8_t>(UINT8_C(3));
             i < static_cast<std::uint_fast8_t>(UINT8_C(14));
           ++i)
  {
    const auto x_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto rootk_half = rootk(x_half, i);

    const auto rootk_ctrl = rootk(local_uintwide_t_small_unsigned_type(x_half), i);

    const auto result_rootk_is_ok = (local_uintwide_t_small_unsigned_type(rootk_half) == rootk_ctrl);

    result_is_ok = (result_rootk_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<signed>(INT8_C(2));
             i < static_cast<signed>(INT8_C(40));
           ++i)
  {
    const auto x_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto shr_half = x_half >> i;

    const auto shr_ctrl = local_uintwide_t_small_unsigned_type(x_half) >> i;

    const auto result_shr_is_ok = (local_uintwide_t_small_unsigned_type(shr_half) == shr_ctrl);

    result_is_ok = (result_shr_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<signed>(INT16_C(1002));
             i < static_cast<signed>(INT16_C(1012));
           ++i)
  {
    const auto x_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto shr_half = x_half >> i;

    const auto shr_ctrl = local_uintwide_t_small_unsigned_type(x_half) >> i;

    const auto result_shr_is_ok = ((local_uintwide_t_small_unsigned_type(shr_half) == shr_ctrl) && (shr_half == 0));

    result_is_ok = (result_shr_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(24));
           ++i)
  {
    const auto left_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto right_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto xor_half = left_half ^ right_half;
    const auto xor_ctrl = (  local_uintwide_t_small_unsigned_type(left_half)
                           ^ local_uintwide_t_small_unsigned_type(right_half));


    const auto result_xor_is_ok = (local_uintwide_t_small_unsigned_type(xor_half) == xor_ctrl);

    result_is_ok = (result_xor_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(32));
           ++i)
  {
    const auto left_half  = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();
    const auto right_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto gcd_half = gcd(left_half, right_half);
    const auto gcd_ctrl = gcd(local_uintwide_t_small_unsigned_type(left_half), local_uintwide_t_small_unsigned_type(right_half));

    const auto result_gcd_is_ok = (local_uintwide_t_small_unsigned_type(gcd_half) == gcd_ctrl);

    result_is_ok = (result_gcd_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<std::uint_fast8_t>(UINT8_C(0));
             i < static_cast<std::uint_fast8_t>(UINT8_C(32));
           ++i)
  {
    const auto x_half_signed =
      generate_wide_integer_value<local_uintwide_t_half_signed_type>
      (
        false,
        local_base::dec,
        static_cast<int>(std::numeric_limits<local_uintwide_t_half_signed_type>::digits10 - 7)
      );

    const auto x_small_unsigned = local_uintwide_t_small_unsigned_type(x_half_signed);
    const auto x_ctrl_signed    = static_cast<local_uintwide_t_half_signed_type>(x_small_unsigned);

    const auto result_convert_is_ok = (x_half_signed == x_ctrl_signed);

    result_is_ok = (result_convert_is_ok && result_is_ok);
  }

  return result_is_ok;
}